

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool ra_portable_deserialize(roaring_array_t *answer,char *buf,size_t maxbytes,size_t *readbytes)

{
  ushort uVar1;
  uint uVar2;
  uint8_t uVar3;
  int32_t iVar4;
  ulong uVar5;
  void **ppvVar6;
  size_t sVar7;
  ulong uVar8;
  array_container_t *container;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  ushort *buf_00;
  char *pcVar13;
  char *pcVar14;
  
  *readbytes = 4;
  if (3 < maxbytes) {
    uVar2 = *(uint *)buf;
    if (uVar2 == 0x303a || (uVar2 & 0xffff) == 0x303b) {
      if ((uVar2 & 0xffff) == 0x303b) {
        uVar8 = (ulong)((uVar2 >> 0x10) + 8 >> 3);
        uVar5 = uVar8 + 4;
        *readbytes = uVar5;
        if (maxbytes < uVar5) {
          return false;
        }
        pcVar14 = buf + 4;
        uVar11 = (uVar2 >> 0x10) + 1;
        pcVar13 = pcVar14 + uVar8;
      }
      else {
        *readbytes = 8;
        if (maxbytes < 8) {
          return false;
        }
        uVar11 = *(uint *)(buf + 4);
        if (0x10000 < uVar11) {
          return false;
        }
        pcVar13 = buf + 8;
        uVar5 = 8;
        pcVar14 = (char *)0x0;
      }
      uVar8 = (ulong)(uVar11 * 4);
      *readbytes = uVar5 + uVar8;
      if ((uVar5 + uVar8 <= maxbytes) && (answer != (roaring_array_t *)0x0)) {
        answer->keys = (uint16_t *)0x0;
        answer->typecodes = (uint8_t *)0x0;
        answer->size = 0;
        answer->allocation_size = 0;
        answer->containers = (void **)0x0;
        answer->flags = '\0';
        if (uVar11 != 0) {
          uVar5 = (ulong)uVar11;
          ppvVar6 = (void **)(*global_memory_hook.malloc)(uVar5 * 0xb);
          if (ppvVar6 == (void **)0x0) {
            return false;
          }
          answer->containers = ppvVar6;
          ppvVar6 = ppvVar6 + uVar5;
          answer->keys = (uint16_t *)ppvVar6;
          answer->typecodes = (uint8_t *)((long)ppvVar6 + uVar5 * 2);
          answer->allocation_size = uVar11;
          uVar9 = 0;
          do {
            *(undefined2 *)((long)ppvVar6 + uVar9 * 2) = *(undefined2 *)(pcVar13 + uVar9 * 4);
            uVar9 = uVar9 + 1;
          } while (uVar5 != uVar9);
        }
        buf_00 = (ushort *)(pcVar13 + uVar8);
        if (((uVar2 & 0xffff) != 0x303b) || (3 < (int)uVar11)) {
          sVar7 = *readbytes;
          *readbytes = sVar7 + uVar8;
          if (maxbytes < sVar7 + uVar8) {
LAB_0011e9cb:
            ra_clear_containers(answer);
            (*global_memory_hook.free)(answer->containers);
            answer->keys = (uint16_t *)0x0;
            answer->typecodes = (uint8_t *)0x0;
            answer->size = 0;
            answer->allocation_size = 0;
            answer->containers = (void **)0x0;
            return false;
          }
          buf_00 = (ushort *)((long)buf_00 + uVar8);
        }
        if ((int)uVar11 < 1) {
          return true;
        }
        uVar5 = 0;
        do {
          uVar1 = *(ushort *)(pcVar13 + uVar5 * 4 + 2);
          iVar4 = (int32_t)((ulong)uVar1 + 1);
          if ((uVar2 & 0xffff) == 0x303b) {
            sVar7 = *readbytes;
            uVar12 = 1 << ((byte)uVar5 & 7) & (uint)(byte)pcVar14[uVar5 >> 3 & 0x1fffffff];
            if ((uVar12 == 0) && (0xfff < uVar1)) {
LAB_0011e895:
              *readbytes = sVar7 + 0x2000;
              if ((maxbytes < sVar7 + 0x2000) ||
                 (container = (array_container_t *)bitset_container_create(),
                 container == (array_container_t *)0x0)) goto LAB_0011e9cb;
              answer->size = answer->size + 1;
              container->cardinality = iVar4;
              memcpy((rle16_t *)container->array,buf_00,0x2000);
              lVar10 = 0x2000;
              uVar3 = '\x01';
            }
            else {
              if (uVar12 == 0) goto LAB_0011e94a;
              uVar8 = sVar7 + 2;
              *readbytes = uVar8;
              if ((maxbytes < uVar8) ||
                 (uVar8 = uVar8 + (ulong)*buf_00 * 4, *readbytes = uVar8, maxbytes < uVar8))
              goto LAB_0011e9cb;
              iVar4 = 0x10;
              container = (array_container_t *)(*global_memory_hook.malloc)(0x10);
              if (container == (array_container_t *)0x0) goto LAB_0011e9cb;
              container->cardinality = 0;
              container->capacity = 0;
              container->array = (uint16_t *)0x0;
              answer->size = answer->size + 1;
              iVar4 = run_container_read(iVar4,(run_container_t *)container,(char *)buf_00);
              lVar10 = (long)iVar4;
              uVar3 = '\x03';
            }
          }
          else {
            sVar7 = *readbytes;
            if (0xfff < uVar1) goto LAB_0011e895;
LAB_0011e94a:
            uVar8 = sVar7 + ((ulong)uVar1 + 1) * 2;
            *readbytes = uVar8;
            if ((maxbytes < uVar8) ||
               (container = array_container_create_given_capacity(iVar4),
               container == (array_container_t *)0x0)) goto LAB_0011e9cb;
            answer->size = answer->size + 1;
            iVar4 = array_container_read(iVar4,container,(char *)buf_00);
            lVar10 = (long)iVar4;
            uVar3 = '\x02';
          }
          buf_00 = (ushort *)((long)buf_00 + lVar10);
          answer->containers[uVar5] = container;
          answer->typecodes[uVar5] = uVar3;
          uVar5 = uVar5 + 1;
          if (uVar11 == uVar5) {
            return true;
          }
        } while( true );
      }
    }
  }
  return false;
}

Assistant:

bool ra_portable_deserialize(roaring_array_t *answer, const char *buf,
                             const size_t maxbytes, size_t *readbytes) {
    *readbytes = sizeof(int32_t);  // for cookie
    if (*readbytes > maxbytes) {
        // Ran out of bytes while reading first 4 bytes.
        return false;
    }
    uint32_t cookie;
    memcpy(&cookie, buf, sizeof(int32_t));
    buf += sizeof(uint32_t);
    if ((cookie & 0xFFFF) != SERIAL_COOKIE &&
        cookie != SERIAL_COOKIE_NO_RUNCONTAINER) {
        // "I failed to find one of the right cookies.
        return false;
    }
    int32_t size;

    if ((cookie & 0xFFFF) == SERIAL_COOKIE)
        size = (cookie >> 16) + 1;
    else {
        *readbytes += sizeof(int32_t);
        if (*readbytes > maxbytes) {
            // Ran out of bytes while reading second part of the cookie.
            return false;
        }
        memcpy(&size, buf, sizeof(int32_t));
        buf += sizeof(uint32_t);
    }
    if (size < 0) {
        // You cannot have a negative number of containers, the data must be
        // corrupted.
        return false;
    }
    if (size > (1 << 16)) {
        // You cannot have so many containers, the data must be corrupted.
        return false;
    }
    const char *bitmapOfRunContainers = NULL;
    bool hasrun = (cookie & 0xFFFF) == SERIAL_COOKIE;
    if (hasrun) {
        int32_t s = (size + 7) / 8;
        *readbytes += s;
        if (*readbytes > maxbytes) {  // data is corrupted?
            // Ran out of bytes while reading run bitmap.
            return false;
        }
        bitmapOfRunContainers = buf;
        buf += s;
    }
    uint16_t *keyscards = (uint16_t *)buf;

    *readbytes += size * 2 * sizeof(uint16_t);
    if (*readbytes > maxbytes) {
        // Ran out of bytes while reading key-cardinality array.
        return false;
    }
    buf += size * 2 * sizeof(uint16_t);

    bool is_ok = ra_init_with_capacity(answer, size);
    if (!is_ok) {
        // Failed to allocate memory for roaring array. Bailing out.
        return false;
    }

    for (int32_t k = 0; k < size; ++k) {
        uint16_t tmp;
        memcpy(&tmp, keyscards + 2 * k, sizeof(tmp));
        answer->keys[k] = tmp;
    }
    if ((!hasrun) || (size >= NO_OFFSET_THRESHOLD)) {
        *readbytes += size * 4;
        if (*readbytes > maxbytes) {  // data is corrupted?
            // Ran out of bytes while reading offsets.
            ra_clear(answer);  // we need to clear the containers already
                               // allocated, and the roaring array
            return false;
        }

        // skipping the offsets
        buf += size * 4;
    }
    // Reading the containers
    for (int32_t k = 0; k < size; ++k) {
        uint16_t tmp;
        memcpy(&tmp, keyscards + 2 * k + 1, sizeof(tmp));
        uint32_t thiscard = tmp + 1;
        bool isbitmap = (thiscard > DEFAULT_MAX_SIZE);
        bool isrun = false;
        if (hasrun) {
            if ((bitmapOfRunContainers[k / 8] & (1 << (k % 8))) != 0) {
                isbitmap = false;
                isrun = true;
            }
        }
        if (isbitmap) {
            // we check that the read is allowed
            size_t containersize =
                BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
            *readbytes += containersize;
            if (*readbytes > maxbytes) {
                // Running out of bytes while reading a bitset container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            // it is now safe to read
            bitset_container_t *c = bitset_container_create();
            if (c == NULL) {  // memory allocation failure
                // Failed to allocate memory for a bitset container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            answer->size++;
            buf += bitset_container_read(thiscard, c, buf);
            answer->containers[k] = c;
            answer->typecodes[k] = BITSET_CONTAINER_TYPE;
        } else if (isrun) {
            // we check that the read is allowed
            *readbytes += sizeof(uint16_t);
            if (*readbytes > maxbytes) {
                // Running out of bytes while reading a run container (header).
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            uint16_t n_runs;
            memcpy(&n_runs, buf, sizeof(uint16_t));
            size_t containersize = n_runs * sizeof(rle16_t);
            *readbytes += containersize;
            if (*readbytes > maxbytes) {  // data is corrupted?
                // Running out of bytes while reading a run container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            // it is now safe to read

            run_container_t *c = run_container_create();
            if (c == NULL) {  // memory allocation failure
                // Failed to allocate memory for a run container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            answer->size++;
            buf += run_container_read(thiscard, c, buf);
            answer->containers[k] = c;
            answer->typecodes[k] = RUN_CONTAINER_TYPE;
        } else {
            // we check that the read is allowed
            size_t containersize = thiscard * sizeof(uint16_t);
            *readbytes += containersize;
            if (*readbytes > maxbytes) {  // data is corrupted?
                // Running out of bytes while reading an array container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            // it is now safe to read
            array_container_t *c =
                array_container_create_given_capacity(thiscard);
            if (c == NULL) {  // memory allocation failure
                // Failed to allocate memory for an array container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            answer->size++;
            buf += array_container_read(thiscard, c, buf);
            answer->containers[k] = c;
            answer->typecodes[k] = ARRAY_CONTAINER_TYPE;
        }
    }
    return true;
}